

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-buffer.c
# Opt level: O3

void test_init(void)

{
  BUFFER buf;
  BUFFER local_38;
  
  local_38.data = (int *)0x0;
  local_38.size = 0;
  local_38.alloc = 0;
  buffer_insert(&local_38,0,"hello",5);
  acutest_check_((uint)(local_38.size == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x27,"%s","buf.size == 5");
  acutest_check_((uint)(local_38.size <= local_38.alloc),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x28,"%s","buf.alloc >= buf.size");
  acutest_check_((uint)((char)*(int *)((long)local_38.data + 4) == 'o' &&
                       *local_38.data == 0x6c6c6568),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x29,"%s","memcmp(buf.data, \"hello\", 5) == 0");
  free(local_38.data);
  return;
}

Assistant:

static void
test_init(void)
{
    BUFFER buf;

    buffer_init(&buf);

    buffer_append(&buf, "hello", 5);

    TEST_CHECK(buf.size == 5);
    TEST_CHECK(buf.alloc >= buf.size);
    TEST_CHECK(memcmp(buf.data, "hello", 5) == 0);

    buffer_fini(&buf);
}